

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::killDuplicateBegin
          (InvocationInterlockPlacementPass *this,BasicBlock *block)

{
  bool bVar1;
  IRContext *this_00;
  anon_class_8_1_a7eb86a2 local_58;
  function<bool_(spvtools::opt::Instruction_*)> local_50;
  undefined1 local_30 [23];
  bool local_19;
  BasicBlock *pBStack_18;
  bool found;
  BasicBlock *block_local;
  InvocationInterlockPlacementPass *this_local;
  
  local_19 = false;
  pBStack_18 = block;
  block_local = (BasicBlock *)this;
  this_00 = Pass::context(&this->super_Pass);
  BasicBlock::begin((BasicBlock *)(local_30 + 8));
  BasicBlock::end((BasicBlock *)local_30);
  local_58.found = &local_19;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::InvocationInterlockPlacementPass::killDuplicateBegin(spvtools::opt::BasicBlock*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_50,&local_58);
  bVar1 = IRContext::KillInstructionIf
                    (this_00,(inst_iterator *)(local_30 + 8),(inst_iterator *)local_30,&local_50);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_50);
  return bVar1;
}

Assistant:

bool InvocationInterlockPlacementPass::killDuplicateBegin(BasicBlock* block) {
  bool found = false;

  return context()->KillInstructionIf(
      block->begin(), block->end(), [&found](Instruction* inst) {
        if (inst->opcode() == spv::Op::OpBeginInvocationInterlockEXT) {
          if (found) {
            return true;
          }
          found = true;
        }
        return false;
      });
}